

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_entropy.c
# Opt level: O3

MPP_RET vp8e_write_entropy_tables(void *hal)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  void *pvVar6;
  uint *puVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  
  lVar3 = *(long *)((long)hal + 0x60);
  puVar4 = (undefined8 *)
           mpp_buffer_get_ptr_with_caller(*(MppBuffer *)(lVar3 + 0x30),"vp8e_write_entropy_tables");
  *puVar4 = 0;
  puVar4[1] = 0;
  puVar4[2] = 0;
  puVar4[3] = 0;
  puVar4[4] = 0;
  puVar4[5] = 0;
  puVar4[6] = 0;
  *(undefined1 *)puVar4 = *(undefined1 *)((long)hal + 0x524);
  *(undefined1 *)((long)puVar4 + 1) = *(undefined1 *)((long)hal + 0x528);
  *(undefined1 *)((long)puVar4 + 2) = *(undefined1 *)((long)hal + 0x52c);
  *(undefined1 *)((long)puVar4 + 3) = *(undefined1 *)((long)hal + 0x530);
  *(undefined1 *)((long)puVar4 + 4) = *(undefined1 *)((long)hal + 0x3630);
  *(undefined1 *)((long)puVar4 + 5) = *(undefined1 *)((long)hal + 0x3634);
  *(undefined1 *)((long)puVar4 + 6) = *(undefined1 *)((long)hal + 0x3638);
  *(undefined1 *)(puVar4 + 1) = *(undefined1 *)((long)hal + 0x544);
  *(undefined1 *)((long)puVar4 + 9) = *(undefined1 *)((long)hal + 0x548);
  *(undefined1 *)((long)puVar4 + 10) = *(undefined1 *)((long)hal + 0x54c);
  *(undefined1 *)((long)puVar4 + 0xb) = *(undefined1 *)((long)hal + 0x550);
  *(undefined1 *)((long)puVar4 + 0xc) = *(undefined1 *)((long)hal + 0x560);
  *(undefined1 *)((long)puVar4 + 0xd) = *(undefined1 *)((long)hal + 0x564);
  *(undefined1 *)((long)puVar4 + 0xe) = *(undefined1 *)((long)hal + 0x568);
  *(undefined1 *)(puVar4 + 2) = *(undefined1 *)((long)hal + 0x34fc);
  *(undefined1 *)((long)puVar4 + 0x11) = *(undefined1 *)((long)hal + 0x34b0);
  *(undefined1 *)((long)puVar4 + 0x12) = *(undefined1 *)((long)hal + 0x3500);
  *(undefined1 *)((long)puVar4 + 0x13) = *(undefined1 *)((long)hal + 0x34b4);
  *(undefined1 *)((long)puVar4 + 0x14) = *(undefined1 *)((long)hal + 0x3540);
  *(undefined1 *)((long)puVar4 + 0x15) = *(undefined1 *)((long)hal + 0x3544);
  *(undefined1 *)((long)puVar4 + 0x16) = *(undefined1 *)((long)hal + 0x34f4);
  *(undefined1 *)((long)puVar4 + 0x17) = *(undefined1 *)((long)hal + 0x34f8);
  lVar9 = 0;
  do {
    *(undefined1 *)((long)puVar4 + lVar9 + 0x18) = *(undefined1 *)((long)hal + lVar9 * 4 + 0x3520);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 8);
  lVar9 = 0;
  do {
    *(undefined1 *)((long)puVar4 + lVar9 + 0x20) = *(undefined1 *)((long)hal + lVar9 * 4 + 0x34d4);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 8);
  lVar9 = 0;
  do {
    *(undefined1 *)((long)puVar4 + lVar9 + 0x28) = *(undefined1 *)((long)hal + lVar9 * 4 + 0x3504);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 7);
  lVar9 = 0;
  do {
    *(undefined1 *)((long)puVar4 + lVar9 + 0x30) = *(undefined1 *)((long)hal + lVar9 * 4 + 0x34b8);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 7);
  if (*(int *)((long)hal + 0x362c) != 0) {
    puVar4 = puVar4 + 7;
    lVar10 = 0;
    lVar9 = (long)hal + 0x13a0;
    do {
      lVar12 = 0;
      lVar11 = lVar9;
      do {
        lVar14 = 0;
        lVar13 = lVar11;
        do {
          lVar15 = 0;
          puVar4 = (undefined8 *)((long)puVar4 + 1);
          do {
            puVar5 = puVar4;
            *(undefined1 *)((long)puVar5 + -1) = *(undefined1 *)(lVar13 + lVar15);
            lVar15 = lVar15 + 4;
            puVar4 = (undefined8 *)((long)puVar5 + 1);
          } while (lVar15 != 0xc);
          *(undefined1 *)puVar5 = 0;
          lVar14 = lVar14 + 1;
          lVar13 = lVar13 + 0x2c;
        } while (lVar14 != 3);
        lVar12 = lVar12 + 1;
        lVar11 = lVar11 + 0x84;
      } while (lVar12 != 8);
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 0x420;
    } while (lVar10 != 4);
    lVar9 = (long)hal + 0x13b0;
    lVar10 = 0;
    do {
      lVar12 = 0;
      lVar11 = lVar9;
      do {
        lVar14 = 0;
        lVar13 = lVar11;
        do {
          lVar15 = 0;
          puVar4 = (undefined8 *)((long)puVar4 + 1);
          do {
            puVar5 = puVar4;
            *(undefined1 *)((long)puVar5 + -1) = *(undefined1 *)(lVar13 + lVar15);
            lVar15 = lVar15 + 4;
            puVar4 = (undefined8 *)((long)puVar5 + 1);
          } while (lVar15 != 0x1c);
          *(undefined1 *)puVar5 =
               *(undefined1 *)
                (lVar14 * 0x2c + 0xc + lVar12 * 0x84 + (long)hal + 0x13a0 + lVar10 * 0x420);
          lVar14 = lVar14 + 1;
          lVar13 = lVar13 + 0x2c;
        } while (lVar14 != 3);
        lVar12 = lVar12 + 1;
        lVar11 = lVar11 + 0x84;
      } while (lVar12 != 8);
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 0x420;
    } while (lVar10 != 4);
  }
  pvVar6 = mpp_buffer_get_ptr_with_caller(*(MppBuffer *)(lVar3 + 0x30),"vp8e_write_entropy_tables");
  if (*(int *)((long)hal + 0x362c) == 0) {
    puVar7 = (uint *)((long)pvVar6 + 4);
    uVar8 = 0x10;
    do {
      uVar1 = puVar7[-1];
      uVar2 = *puVar7;
      puVar7[-1] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      *puVar7 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      puVar7 = puVar7 + 2;
      uVar8 = uVar8 - 2;
    } while (2 < uVar8);
  }
  else {
    puVar7 = (uint *)((long)pvVar6 + 4);
    uVar8 = 0x130;
    do {
      uVar1 = puVar7[-1];
      uVar2 = *puVar7;
      puVar7[-1] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      *puVar7 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      puVar7 = puVar7 + 2;
      uVar8 = uVar8 - 2;
    } while (2 < uVar8);
  }
  mpp_buffer_sync_end_f(*(MppBuffer *)(lVar3 + 0x30),0,"vp8e_write_entropy_tables");
  return MPP_OK;
}

Assistant:

MPP_RET vp8e_write_entropy_tables(void *hal)
{
    HalVp8eCtx *ctx = (HalVp8eCtx *)hal;

    Vp8eVpuBuf *buffers = (Vp8eVpuBuf *)ctx->buffers;
    Vp8eHalEntropy *entropy = &ctx->entropy;

    RK_U8 *table = (RK_U8 *)mpp_buffer_get_ptr(buffers->hw_cabac_table_buf);
    /* Write probability tables to ASIC linear memory, reg + mem */
    memset(table, 0, 56);  // use 56 bytes
    table[0] = entropy->skip_false_prob;
    table[1] = entropy->intra_prob;
    table[2] = entropy->last_prob;
    table[3] = entropy->gf_prob;
    table[4] = entropy->segment_prob[0];
    table[5] = entropy->segment_prob[1];
    table[6] = entropy->segment_prob[2];

    table[8]  = entropy->y_mode_prob[0];
    table[9]  = entropy->y_mode_prob[1];
    table[10] = entropy->y_mode_prob[2];
    table[11] = entropy->y_mode_prob[3];
    table[12] = entropy->uv_mode_prob[0];
    table[13] = entropy->uv_mode_prob[1];
    table[14] = entropy->uv_mode_prob[2];

    /* MV probabilities x+y: short, sign, size 8-9 */
    table[16] = entropy->mv_prob[1][0];
    table[17] = entropy->mv_prob[0][0];
    table[18] = entropy->mv_prob[1][1];
    table[19] = entropy->mv_prob[0][1];
    table[20] = entropy->mv_prob[1][17];
    table[21] = entropy->mv_prob[1][18];
    table[22] = entropy->mv_prob[0][17];
    table[23] = entropy->mv_prob[0][18];
    {
        RK_S32 i, j, k, l;
        /* MV X size */
        for (i = 0; i < 8; i++)
            table[24 + i] = entropy->mv_prob[1][9 + i];

        /* MV Y size */
        for (i = 0; i < 8; i++)
            table[32 + i] = entropy->mv_prob[0][9 + i];

        /* MV X short tree */
        for (i = 0; i < 7; i++)
            table[40 + i] = entropy->mv_prob[1][2 + i];

        /* MV Y short tree */
        for (i = 0; i < 7; i++)
            table[48 + i] = entropy->mv_prob[0][2 + i];

        /* Update the ASIC table when needed. */
        if (entropy->update_coeff_prob_flag) {
            table += 56;
            /* DCT coeff probabilities 0-2, two fields per line. */
            for (i = 0; i < 4; i++)
                for (j = 0; j < 8; j++)
                    for (k = 0; k < 3; k++) {
                        for (l = 0; l < 3; l++) {
                            *table++ = entropy->coeff_prob[i][j][k][l];
                        }
                        *table++ = 0;
                    }

            /* ASIC second probability table in ext mem.
             * DCT coeff probabilities 4 5 6 7 8 9 10 3 on each line.
             * coeff 3 was moved from first table to second so it is last. */
            for (i = 0; i < 4; i++)
                for (j = 0; j < 8; j++)
                    for (k = 0; k < 3; k++) {
                        for (l = 4; l < 11; l++) {
                            *table++ = entropy->coeff_prob[i][j][k][l];
                        }
                        *table++ = entropy->coeff_prob[i][j][k][3];
                    }
        }
    }
    table = mpp_buffer_get_ptr(buffers->hw_cabac_table_buf);
    if (entropy->update_coeff_prob_flag)
        vp8e_swap_endian((RK_U32 *) table, 56 + 8 * 48 + 8 * 96);
    else
        vp8e_swap_endian((RK_U32 *) table, 56);

    mpp_buffer_sync_end(buffers->hw_cabac_table_buf);

    return MPP_OK;
}